

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O2

void utest_gui_component_parse_slider_3(int *utest_result,size_t utest_index)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator<char> local_139;
  string error;
  string line;
  string uniform_line;
  GUIComponent component;
  char *local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  uniform_line._M_dataplus._M_p = (pointer)&uniform_line.field_2;
  uniform_line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  uniform_line.field_2._M_local_buf[0] = '\0';
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  component._48_8_ = 0;
  component.Data[1] = 0.0;
  component.Data[2] = 0.0;
  component.UniformName.field_2._8_8_ = 0;
  component._40_8_ = 0;
  component.UniformName._M_string_length = 0;
  component.UniformName.field_2._M_allocated_capacity = 0;
  component.Type = EGUIComponentTypeSlider1;
  component.UniformType = EGUIUniformTypeFloat;
  component.UniformName._M_dataplus._M_p = (pointer)0x0;
  component.Data[3] = 0.0;
  component._68_4_ = 0;
  std::__cxx11::string::assign((char *)&line);
  std::__cxx11::string::assign((char *)&uniform_line);
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  bVar2 = GUIComponentParse(0,&line,&uniform_line,
                            (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                            &component,&error);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
  if (!bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xcf);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xcf);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_168._M_dataplus._M_p = (pointer)0x0;
      local_168._M_string_length = 0;
      local_168.field_2._M_allocated_capacity = 0;
      bVar2 = GUIComponentParse(0,&line,&uniform_line,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                                &component,&error);
      pcVar5 = "false";
      if (bVar2) {
        pcVar5 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar5);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
    }
    local_168._M_dataplus._M_p = (pointer)0x0;
    local_168._M_string_length = 0;
    local_168.field_2._M_allocated_capacity = 0;
    bVar2 = GUIComponentParse(0,&line,&uniform_line,
                              (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                              &component,&error);
    pcVar5 = "false";
    if (bVar2) {
      pcVar5 = "true";
    }
    printf("    Actual : %s\n",pcVar5);
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
    *utest_result = 1;
  }
  if ((component.field_4.SliderRange.Start != -1.0) || (NAN(component.field_4.SliderRange.Start))) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd0);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd0);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar5 = "true";
      if (component.field_4.SliderRange.Start != -1.0) {
        pcVar5 = "false";
      }
      if (NAN(component.field_4.SliderRange.Start)) {
        pcVar5 = "false";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar5);
    }
    pcVar5 = "true";
    if (component.field_4.SliderRange.Start != -1.0) {
      pcVar5 = "false";
    }
    if (NAN(component.field_4.SliderRange.Start)) {
      pcVar5 = "false";
    }
    printf("    Actual : %s\n",pcVar5);
    *utest_result = 1;
  }
  if ((component.field_4.SliderRange.End != 2.5) || (NAN(component.field_4.SliderRange.End))) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd1);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd1);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar5 = "true";
      if (component.field_4.SliderRange.End != 2.5) {
        pcVar5 = "false";
      }
      if (NAN(component.field_4.SliderRange.End)) {
        pcVar5 = "false";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar5);
    }
    pcVar5 = "true";
    if (component.field_4.SliderRange.End != 2.5) {
      pcVar5 = "false";
    }
    if (NAN(component.field_4.SliderRange.End)) {
      pcVar5 = "false";
    }
    printf("    Actual : %s\n",pcVar5);
    *utest_result = 1;
  }
  if (component.UniformType != EGUIUniformTypeVec3) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd2);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd2);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar5 = "false";
      if (component.UniformType == EGUIUniformTypeVec3) {
        pcVar5 = "true";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar5);
    }
    pcVar5 = "false";
    if (component.UniformType == EGUIUniformTypeVec3) {
      pcVar5 = "true";
    }
    printf("    Actual : %s\n",pcVar5);
    *utest_result = 1;
  }
  if (error._M_string_length != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd3);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd3);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    if (utest_state.output != (FILE *)0x0) {
      pcVar5 = "false";
      if (error._M_string_length == 0) {
        pcVar5 = "true";
      }
      fprintf((FILE *)utest_state.output,"    Actual : %s\n",pcVar5);
    }
    pcVar5 = "false";
    if (error._M_string_length == 0) {
      pcVar5 = "true";
    }
    printf("    Actual : %s\n",pcVar5);
    *utest_result = 1;
  }
  std::__cxx11::string::assign((char *)&line);
  std::__cxx11::string::assign((char *)&uniform_line);
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  bVar2 = GUIComponentParse(0,&line,&uniform_line,
                            (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                            &component,&error);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
  if (bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd7);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd7);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_168._M_dataplus._M_p = (pointer)0x0;
      local_168._M_string_length = 0;
      local_168.field_2._M_allocated_capacity = 0;
      bVar2 = GUIComponentParse(0,&line,&uniform_line,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                                &component,&error);
      pcVar5 = "true";
      if (bVar2) {
        pcVar5 = "false";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar5);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
    }
    local_168._M_dataplus._M_p = (pointer)0x0;
    local_168._M_string_length = 0;
    local_168.field_2._M_allocated_capacity = 0;
    bVar2 = GUIComponentParse(0,&line,&uniform_line,
                              (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                              &component,&error);
    pcVar5 = "true";
    if (bVar2) {
      pcVar5 = "false";
    }
    printf("    Actual : %s\n",pcVar5);
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
    *utest_result = 1;
  }
  iVar3 = strcmp(error._M_dataplus._M_p,
                 "Invalid format for GUI component data \'()\'\nFormat should be @slider3(start_range, end_range) at line 0"
                );
  if (iVar3 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xd8);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xd8);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      iVar3 = strcmp(error._M_dataplus._M_p,
                     "Invalid format for GUI component data \'()\'\nFormat should be @slider3(start_range, end_range) at line 0"
                    );
      pcVar5 = "false";
      if (iVar3 == 0) {
        pcVar5 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar5);
    }
    iVar3 = strcmp(error._M_dataplus._M_p,
                   "Invalid format for GUI component data \'()\'\nFormat should be @slider3(start_range, end_range) at line 0"
                  );
    pcVar5 = "false";
    if (iVar3 == 0) {
      pcVar5 = "true";
    }
    printf("    Actual : %s\n",pcVar5);
    *utest_result = 1;
  }
  std::__cxx11::string::assign((char *)&line);
  std::__cxx11::string::assign((char *)&uniform_line);
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  bVar2 = GUIComponentParse(2,&line,&uniform_line,
                            (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                            &component,&error);
  std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
            ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
  if (bVar2) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xdc);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xdc);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_168._M_dataplus._M_p = (pointer)0x0;
      local_168._M_string_length = 0;
      local_168.field_2._M_allocated_capacity = 0;
      bVar2 = GUIComponentParse(2,&line,&uniform_line,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                                &component,&error);
      pcVar5 = "true";
      if (bVar2) {
        pcVar5 = "false";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar5);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
    }
    local_168._M_dataplus._M_p = (pointer)0x0;
    local_168._M_string_length = 0;
    local_168.field_2._M_allocated_capacity = 0;
    bVar2 = GUIComponentParse(2,&line,&uniform_line,
                              (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                              &component,&error);
    pcVar5 = "true";
    if (bVar2) {
      pcVar5 = "false";
    }
    printf("    Actual : %s\n",pcVar5);
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
    *utest_result = 1;
  }
  iVar3 = strcmp(error._M_dataplus._M_p,
                 "Invalid format for GUI component data \'(5.0)\'\nFormat should be @slider3(start_range, end_range) at line 2"
                );
  if (iVar3 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0xdd);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0xdd);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      iVar3 = strcmp(error._M_dataplus._M_p,
                     "Invalid format for GUI component data \'(5.0)\'\nFormat should be @slider3(start_range, end_range) at line 2"
                    );
      pcVar5 = "false";
      if (iVar3 == 0) {
        pcVar5 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar5);
    }
    iVar3 = strcmp(error._M_dataplus._M_p,
                   "Invalid format for GUI component data \'(5.0)\'\nFormat should be @slider3(start_range, end_range) at line 2"
                  );
    pcVar5 = "false";
    if (iVar3 == 0) {
      pcVar5 = "true";
    }
    printf("    Actual : %s\n",pcVar5);
    *utest_result = 1;
  }
  std::__cxx11::string::assign((char *)&line);
  local_80[0] = "float";
  local_80[1] = "vec2";
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 0x10) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,*(char **)((long)local_80 + lVar4),&local_139);
    std::operator+(&local_50,"uniform ",&local_70);
    std::operator+(&local_168,&local_50," v0;");
    std::__cxx11::string::operator=((string *)&uniform_line,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    local_168._M_dataplus._M_p = (pointer)0x0;
    local_168._M_string_length = 0;
    local_168.field_2._M_allocated_capacity = 0;
    bVar2 = GUIComponentParse(5,&line,&uniform_line,
                              (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                              &component,&error);
    std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
              ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
    if (bVar2) {
      if (utest_state.output != (FILE *)0x0) {
        fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
                ,0xe2);
      }
      printf("%s:%u: Failure\n",
             "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
             ,0xe2);
      if (utest_state.output != (FILE *)0x0) {
        fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
      }
      puts("  Expected : true");
      pFVar1 = utest_state.output;
      if (utest_state.output != (FILE *)0x0) {
        local_168._M_dataplus._M_p = (pointer)0x0;
        local_168._M_string_length = 0;
        local_168.field_2._M_allocated_capacity = 0;
        bVar2 = GUIComponentParse(5,&line,&uniform_line,
                                  (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                                  &component,&error);
        pcVar5 = "true";
        if (bVar2) {
          pcVar5 = "false";
        }
        fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar5);
        std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                  ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
      }
      local_168._M_dataplus._M_p = (pointer)0x0;
      local_168._M_string_length = 0;
      local_168.field_2._M_allocated_capacity = 0;
      bVar2 = GUIComponentParse(5,&line,&uniform_line,
                                (vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168,
                                &component,&error);
      pcVar5 = "true";
      if (bVar2) {
        pcVar5 = "false";
      }
      printf("    Actual : %s\n",pcVar5);
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::~vector
                ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)&local_168);
      *utest_result = 1;
    }
    iVar3 = strcmp(error._M_dataplus._M_p,
                   "GUI component count does not match uniform component count at line 5");
    if (iVar3 != 0) {
      if (utest_state.output != (FILE *)0x0) {
        fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
                ,0xe3);
      }
      printf("%s:%u: Failure\n",
             "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
             ,0xe3);
      if (utest_state.output != (FILE *)0x0) {
        fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
      }
      puts("  Expected : true");
      pFVar1 = utest_state.output;
      if (utest_state.output != (FILE *)0x0) {
        iVar3 = strcmp(error._M_dataplus._M_p,
                       "GUI component count does not match uniform component count at line 5");
        pcVar5 = "false";
        if (iVar3 == 0) {
          pcVar5 = "true";
        }
        fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar5);
      }
      iVar3 = strcmp(error._M_dataplus._M_p,
                     "GUI component count does not match uniform component count at line 5");
      pcVar5 = "false";
      if (iVar3 == 0) {
        pcVar5 = "true";
      }
      printf("    Actual : %s\n",pcVar5);
      *utest_result = 1;
    }
    lVar4 = lVar4 + 8;
  }
  std::__cxx11::string::~string((string *)&component.UniformName);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&uniform_line);
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

UTEST(gui, component_parse_slider_3) {
    std::string line, uniform_line, error;
    GUIComponent component;

    line = "slider3(-1, 2.5)";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(0, line, uniform_line, {}, component, error));
    T(component.SliderRange.Start == -1);
    T(component.SliderRange.End == 2.5);
    T(component.UniformType == EGUIUniformTypeVec3);
    T(error.empty());

    line = "slider3()";
    uniform_line = "uniform vec3 v0;";
    T(!GUIComponentParse(0, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid format for GUI component data '()'\nFormat should be @slider3(start_range, end_range) at line 0");

    line = "slider3(5.0)";
    uniform_line = "uniform vec3 v0;";
    T(!GUIComponentParse(2, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid format for GUI component data '(5.0)'\nFormat should be @slider3(start_range, end_range) at line 2");

    line = "slider3(-1, 2.5)";
    for (const auto& datatype : {"float", "vec2"}) {
        uniform_line = "uniform " + std::string(datatype) + " v0;";
        T(!GUIComponentParse(5, line, uniform_line, {}, component, error));
        TSTR(error.c_str(), "GUI component count does not match uniform component count at line 5");
    }
}